

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Ptr<Catch::Config> * __thiscall
Catch::Ptr<Catch::Config>::operator=(Ptr<Catch::Config> *this,Config *p)

{
  Config *pCVar1;
  
  if (p != (Config *)0x0) {
    (*(p->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
      _vptr_NonCopyable[2])(p);
  }
  pCVar1 = this->m_p;
  this->m_p = p;
  if (pCVar1 != (Config *)0x0) {
    (*(pCVar1->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
      _vptr_NonCopyable[3])();
  }
  return this;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }